

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall
Address_SegwitAddressFromStringTest_Test::TestBody(Address_SegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  AssertHelperData *pAVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  Address address;
  AssertHelper local_348;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  AssertHelper local_338;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  uchar *local_308;
  uchar local_2f8 [16];
  pointer local_2e8;
  void *local_2d0;
  void *local_2b8;
  code *local_2a0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_228;
  Script local_210;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined1 *local_190;
  undefined1 local_180 [16];
  void *local_170;
  long local_168;
  void *local_158;
  long local_150;
  void *local_140;
  long local_138;
  code *local_128 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b0;
  Script local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  
  cfd::core::Address::Address((Address *)&local_1a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338.data_ = (AssertHelperData *)local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q","");
      cfd::core::Address::Address((Address *)local_318,(string *)&local_338);
      cfd::core::Address::operator=((Address *)&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0[0] = cfd::core::SchnorrSignature::SchnorrSignature;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2a0);
      if (local_2b8 != (void *)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (void *)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if (local_308 != local_2f8) {
        operator_delete(local_308);
      }
      if (local_338.data_ != (AssertHelperData *)local_328) {
        operator_delete(local_338.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1aa,
               "Expected: (address = Address(\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q\"",
             "address.GetAddress().c_str()","bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_318);
    if (sStack_330.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_330.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ac,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.data_ = local_338.data_ & 0xffffffff00000000;
  local_348.data_._0_4_ = local_1a0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kMainnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ad,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_._0_4_ = 4;
  local_348.data_._0_4_ = local_19c;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ae,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_ = local_338.data_ & 0xffffffff00000000;
  local_348.data_._0_4_ = local_198;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1af,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_ = (AssertHelperData *)0x0;
  sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328._0_8_ = 0;
  uVar3 = local_168 - (long)local_170;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_328._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_168 - (long)local_170;
  local_338.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_170,sVar4);
  }
  sStack_330.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_338.data_);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.data_ = (AssertHelperData *)0x0;
  sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328._0_8_ = 0;
  uVar3 = local_150 - (long)local_158;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_328._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_150 - (long)local_158;
  local_338.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_158,sVar4);
  }
  sStack_330.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::Pubkey::GetHex_abi_cxx11_();
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_338.data_);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_318,&local_98);
  cfd::core::Script::GetHex_abi_cxx11_();
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"\"","address.GetScript().GetHex().c_str()","",
             (char *)local_338.data_);
  if (local_338.data_ != (AssertHelperData *)local_328) {
    operator_delete(local_338.data_);
  }
  cfd::core::Script::~Script((Script *)local_318);
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338.data_ = (AssertHelperData *)local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,
                 "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt","");
      cfd::core::Address::Address((Address *)local_318,(string *)&local_338);
      cfd::core::Address::operator=((Address *)&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0[0] = cfd::core::SchnorrSignature::SchnorrSignature;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2a0);
      if (local_2b8 != (void *)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (void *)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if (local_308 != local_2f8) {
        operator_delete(local_308);
      }
      if (local_338.data_ != (AssertHelperData *)local_328) {
        operator_delete(local_338.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b5,
               "Expected: (address = Address(\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,
             "\"tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt\"",
             "address.GetAddress().c_str()",
             "tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_318);
    if (sStack_330.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_330.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.data_._0_4_ = 1;
  local_348.data_._0_4_ = local_1a0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kTestnet","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_._0_4_ = 3;
  local_348.data_._0_4_ = local_19c;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2wshAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1b9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_ = local_338.data_ & 0xffffffff00000000;
  local_348.data_._0_4_ = local_198;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ba,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338.data_ = (AssertHelperData *)local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6","");
      cfd::core::Address::Address((Address *)local_318,(string *)&local_338);
      cfd::core::Address::operator=((Address *)&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0[0] = cfd::core::SchnorrSignature::SchnorrSignature;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2a0);
      if (local_2b8 != (void *)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (void *)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if (local_308 != local_2f8) {
        operator_delete(local_308);
      }
      if (local_338.data_ != (AssertHelperData *)local_328) {
        operator_delete(local_338.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1bc,
               "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,"\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6\"",
             "address.GetAddress().c_str()","bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_318);
    if (sStack_330.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_330.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.data_._0_4_ = 2;
  local_348.data_._0_4_ = local_1a0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kRegtest","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1bf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_._0_4_ = 4;
  local_348.data_._0_4_ = local_19c;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kP2wpkhAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_ = local_338.data_ & 0xffffffff00000000;
  local_348.data_._0_4_ = local_198;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion0","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_338.data_ = (AssertHelperData *)local_328;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_338,
                 "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq","");
      cfd::core::Address::Address((Address *)local_318,(string *)&local_338);
      cfd::core::Address::operator=((Address *)&local_1a0,(Address *)local_318);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1d0);
      cfd::core::Script::~Script(&local_210);
      local_2a0[0] = cfd::core::SchnorrSignature::SchnorrSignature;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_228);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2a0);
      if (local_2b8 != (void *)0x0) {
        operator_delete(local_2b8);
      }
      if (local_2d0 != (void *)0x0) {
        operator_delete(local_2d0);
      }
      if (local_2e8 != (pointer)0x0) {
        operator_delete(local_2e8);
      }
      if (local_308 != local_2f8) {
        operator_delete(local_308);
      }
      if (local_338.data_ != (AssertHelperData *)local_328) {
        operator_delete(local_338.data_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_318);
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c3,
               "Expected: (address = Address(\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_338,
             "\"bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq\"",
             "address.GetAddress().c_str()",
             "bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_318);
    if (sStack_330.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((sStack_330.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_330,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.data_._0_4_ = 2;
  local_348.data_._0_4_ = local_1a0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_318,"NetType::kRegtest","address.GetNetType()",(NetType *)&local_338,
             (NetType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_._0_4_ = 7;
  local_348.data_._0_4_ = local_19c;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_318,"AddressType::kTaprootAddress","address.GetAddressType()",
             (AddressType *)&local_338,(AddressType *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_._0_4_ = 1;
  local_348.data_._0_4_ = local_198;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_318,"WitnessVersion::kVersion1","address.GetWitnessVersion()",
             (WitnessVersion *)&local_338,(WitnessVersion *)&local_348);
  if (local_318[0] == (Address)0x0) {
    testing::Message::Message((Message *)&local_338);
    if ((pointer)local_318._8_8_ == (pointer)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_318._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1c8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&local_338);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    if (local_338.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_338.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_338.data_ + 8))();
      }
      local_338.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_318 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_338.data_ = (AssertHelperData *)0x0;
  sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328._0_8_ = 0;
  uVar3 = local_168 - (long)local_170;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_328._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_168 - (long)local_170;
  local_338.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_170,sVar4);
  }
  sStack_330.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetHash().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_338.data_);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1ca,pcVar5);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_338.data_ = (AssertHelperData *)0x0;
  sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_328._0_8_ = 0;
  uVar3 = local_138 - (long)local_140;
  if (uVar3 == 0) {
    pAVar2 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar2 = (AssertHelperData *)operator_new(uVar3);
  }
  local_328._0_8_ = uVar3 + (long)pAVar2;
  sVar4 = local_138 - (long)local_140;
  local_338.data_ = pAVar2;
  if (sVar4 != 0) {
    sStack_330.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar2;
    memmove(pAVar2,local_140,sVar4);
  }
  sStack_330.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)((long)pAVar2 + sVar4);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "address.GetSchnorrPubkey().GetHex().c_str()",
             "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
             (char *)local_318._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_308) {
    operator_delete((void *)local_318._0_8_);
  }
  if (local_338.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_338.data_);
  }
  if (local_348.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_318);
    if (local_340.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_340.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
               ,0x1cc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_338);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(uchar **)local_318._0_8_ + 8))();
      }
      local_318._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_340,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_338.data_ = (AssertHelperData *)local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6","");
    cfd::core::Address::Address((Address *)local_318,(string *)&local_338);
    cfd::core::Address::operator=((Address *)&local_1a0,(Address *)local_318);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1d0);
    cfd::core::Script::~Script(&local_210);
    local_2a0[0] = cfd::core::SchnorrSignature::SchnorrSignature;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_228);
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_2a0);
    if (local_2b8 != (void *)0x0) {
      operator_delete(local_2b8);
    }
    if (local_2d0 != (void *)0x0) {
      operator_delete(local_2d0);
    }
    if (local_2e8 != (pointer)0x0) {
      operator_delete(local_2e8);
    }
    if (local_308 != local_2f8) {
      operator_delete(local_308);
    }
    if (local_338.data_ != (AssertHelperData *)local_328) {
      operator_delete(local_338.data_);
    }
  }
  testing::Message::Message((Message *)local_318);
  testing::internal::AssertHelper::AssertHelper
            (&local_338,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_address.cpp"
             ,0x1d0,
             "Expected: (address = Address(\"bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_338,(Message *)local_318);
  testing::internal::AssertHelper::~AssertHelper(&local_338);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(uchar **)local_318._0_8_ + 8))();
    }
    local_318._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
    ;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58);
  cfd::core::Script::~Script(&local_98);
  local_128[0] = cfd::core::SchnorrSignature::SchnorrSignature;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_b0);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_128);
  if (local_140 != (void *)0x0) {
    operator_delete(local_140);
  }
  if (local_158 != (void *)0x0) {
    operator_delete(local_158);
  }
  if (local_170 != (void *)0x0) {
    operator_delete(local_170);
  }
  if (local_190 != local_180) {
    operator_delete(local_190);
  }
  return;
}

Assistant:

TEST(Address, SegwitAddressFromStringTest) {
  Address address;
  EXPECT_NO_THROW((address = Address("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q")));
  EXPECT_STREQ("bc1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5uax7v9q",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt")));
  EXPECT_STREQ("tb1qcc5c9wnzly8zj2dcsvxv83kupsu0uamx69u0y9lsmw7shuns2gqs44ltpt",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6")));
  EXPECT_STREQ("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujf6",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kP2wpkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion0, address.GetWitnessVersion());

  EXPECT_NO_THROW((address = Address("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq")));
  EXPECT_STREQ("bcrt1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8nasmsdlvq",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kRegtest, address.GetNetType());
  EXPECT_EQ(AddressType::kTaprootAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersion1, address.GetWitnessVersion());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetHash().GetHex().c_str());
  EXPECT_STREQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
              address.GetSchnorrPubkey().GetHex().c_str());

  // Illegal data
  EXPECT_THROW((address = Address("bcrt1qjfw5q2ygp0gvn450h3lu0hlwjanfsc5u4fujx6")),
               CfdException);
}